

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::DeleteProperty
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,JavascriptString *propertyNameString,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  Var descriptor_00;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  charcount_t cVar5;
  BOOL BVar6;
  int iVar7;
  PropertyId propertyId;
  char16 *pcVar8;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *pSVar9;
  DynamicType *pDVar10;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar11;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar12;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar13;
  RecyclerWeakReference<Js::DynamicObject> *this_02;
  DynamicObject *pDVar14;
  ScriptContext *scriptContext_00;
  undefined4 extraout_var;
  Type *this_03;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this_04;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *simpleBase;
  bool fConvertToStringKeyedHandler;
  Var undefined;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  CharacterBuffer<char16_t> propertyName;
  ScriptContext *scriptContext;
  PropertyOperationFlags propertyOperationFlags_local;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this_local;
  
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar5 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar8,cVar5);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x617,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* "
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar3 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
  if (bVar3) {
    this_04 = ConvertToNonSharedSimpleDictionaryType(this,instance);
    BVar6 = DeleteProperty(this_04,instance,propertyNameString,propertyOperationFlags);
    return BVar6;
  }
  if (((((DAT_01eca29c & 1) != 0) &&
       (bVar3 = TMapKey_IsJavascriptString<Js::JavascriptString*>(), !bVar3)) &&
      (((byte)this->field_0x28 >> 1 & 1) == 0)) && (((byte)this->field_0x28 >> 2 & 1) == 0)) {
    pSVar9 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
             ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
                        instance);
    BVar6 = DeleteProperty(&pSVar9->
                            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>
                           ,instance,propertyNameString,propertyOperationFlags);
    return BVar6;
  }
  pDVar10 = DynamicObject::GetDynamicType(instance);
  bVar3 = DynamicType::GetIsLocked(pDVar10);
  if (bVar3) {
    bVar3 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
    if (bVar3) {
LAB_0145c617:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x627,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    else {
      pDVar10 = DynamicObject::GetDynamicType(instance);
      bVar3 = DynamicType::GetIsShared(pDVar10);
      if (bVar3) goto LAB_0145c617;
    }
    DynamicObject::ChangeType(instance);
  }
  propertyName._8_8_ = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar5 = JavascriptString::GetLength(propertyNameString);
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
            ((CharacterBuffer<char16_t> *)&descriptor,pcVar8,cVar5);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)&descriptor,
                     (SimpleDictionaryPropertyDescriptor<int> **)&undefined);
  uVar2 = propertyName._8_8_;
  if (!bVar3) {
    return 1;
  }
  if ((*(byte *)((long)undefined + 1) & 8) != 0) {
    return 1;
  }
  if ((*(byte *)((long)undefined + 1) & 2) == 0) {
    pcVar8 = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
              (propertyOperationFlags,(ScriptContext *)uVar2,pcVar8);
    return 0;
  }
  if ((*(byte *)((long)undefined + 1) & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x643,"(!(descriptor->Attributes & 0x10))",
                                "!(descriptor->Attributes & PropertyLetConstGlobal)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  this_01 = ScriptContext::GetLibrary((ScriptContext *)propertyName._8_8_);
  pRVar12 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  if (*(int *)((long)undefined + 4) != -1) {
    bVar3 = SupportsSwitchingToUnordered(this,(ScriptContext *)propertyName._8_8_);
    if ((bVar3) &&
       (this->numDeletedProperties = this->numDeletedProperties + '\x01',
       DAT_01eca298 <= (int)(uint)this->numDeletedProperties)) {
      bVar3 = false;
      if (((byte)this->field_0x28 >> 2 & 1) == 0) {
        pRVar12 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                            (&instance->super_RecyclableObject,(RecyclableObject **)0x0);
        bVar3 = pRVar12 == (RecyclableObject *)0x0;
      }
      if (bVar3) {
        bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,TypeHandlerTransitionPhase);
        if (bVar3) {
          Output::Print(L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n");
          Output::Flush();
        }
        pSVar9 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
                 ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                           ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
                            instance);
        BVar6 = DeleteProperty(&pSVar9->
                                super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>
                               ,instance,propertyNameString,propertyOperationFlags);
        return BVar6;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,TypeHandlerTransitionPhase);
      if (bVar3) {
        Output::Print(
                     L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                     );
        Output::Flush();
      }
      pSVar9 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
                          instance);
      BVar6 = DeleteProperty(&pSVar9->
                              super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>
                             ,instance,propertyNameString,propertyOperationFlags);
      return BVar6;
    }
    ppRVar13 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar13 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      this_02 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      pDVar14 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_02);
      if (instance != pDVar14) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x66f,
                                    "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                    ,
                                    "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
    descriptor_00 = undefined;
    scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
    InvalidateFixedField<Js::JavascriptString*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this,
               propertyNameString,(SimpleDictionaryPropertyDescriptor<int> *)descriptor_00,
               scriptContext_00);
    bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
    uVar2 = propertyName._8_8_;
    if ((bVar4 & 0x20) != 0) {
      iVar7 = (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      cVar5 = JavascriptString::GetLength(propertyNameString);
      propertyId = ScriptContext::GetOrAddPropertyIdTracked
                             ((ScriptContext *)uVar2,(LPCWSTR)CONCAT44(extraout_var,iVar7),cVar5);
      ScriptContext::InvalidateProtoCaches((ScriptContext *)uVar2,propertyId);
    }
    if (((byte)this->field_0x28 >> 1 & 1) != 0) {
      pSVar9 = AsUnordered(this);
      bVar3 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>::
              TryRegisterDeletedPropertyIndex(pSVar9,instance,*(int *)((long)undefined + 4));
      if (bVar3) goto LAB_0145cabd;
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,*(int *)((long)undefined + 4),pRVar12);
  }
LAB_0145cabd:
  *(undefined1 *)((long)undefined + 1) = 0xe;
  this_03 = RecyclableObject::GetType(&instance->super_RecyclableObject);
  BVar6 = Js::Type::HasBeenCached(this_03);
  if (BVar6 != 0) {
    DynamicObject::ChangeType(instance);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,(CharacterBuffer<char16_t> *)&descriptor,
             (Var)0x0,SideEffects_Any);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty(DynamicObject* instance, JavascriptString* propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        if (!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();

            JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyName, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyNameString->GetString()); // or propertyName->GetBuffer

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyNameString, descriptor, instance->GetScriptContext());
#endif
                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetSz(), propertyNameString->GetLength()));
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if (!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
        }
        return true;
    }